

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::storeObject
               (ValueVectorOf<unsigned_int> *objToStore,XSerializeEngine *serEng)

{
  XMLSize_t t;
  bool bVar1;
  uint *puVar2;
  XMLSize_t i;
  XMLSize_t getAt;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = objToStore->fCurCount;
    XSerializeEngine::writeSize(serEng,t);
    for (getAt = 0; t != getAt; getAt = getAt + 1) {
      puVar2 = ValueVectorOf<unsigned_int>::elementAt(objToStore,getAt);
      XSerializeEngine::operator<<(serEng,*puVar2);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(ValueVectorOf<unsigned int>* const objToStore
                                    , XSerializeEngine&                  serEng)
{
    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorSize = objToStore->size();
        serEng.writeSize (vectorSize);

        for (XMLSize_t i = 0; i < vectorSize; i++)
        {
            unsigned int& data = objToStore->elementAt(i);
            serEng<<data;
        }
    }
}